

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedType<unsigned_short>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedType<unsigned_short> min,WrappedType<unsigned_short> max,float gridSize)

{
  deUint32 dVar1;
  int iVar2;
  long lVar3;
  undefined2 uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  short sVar8;
  uint uVar9;
  int iVar10;
  short sVar11;
  uint uVar12;
  uint uVar13;
  short sVar14;
  undefined2 uVar15;
  uint uVar16;
  short sVar17;
  uint uVar18;
  float fVar19;
  deRandom rnd;
  uint local_b0;
  deRandom local_98;
  ulong local_88;
  int local_7c;
  int local_78;
  int local_74;
  char *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  char *local_40;
  ulong local_38;
  
  uVar7 = componentCount * 2;
  if (stride != 0) {
    uVar7 = stride;
  }
  local_38 = (ulong)(uVar7 * 2);
  iVar5 = uVar7 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar5 = 0;
  }
  local_70 = (char *)operator_new__((long)(iVar5 * count + offset));
  deRandom_init(&local_98,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar19 = (float)max.m_value - (float)min.m_value;
    uVar18 = -(uint)(-fVar19 <= fVar19);
    uVar6 = (uint)((float)(~uVar18 & (uint)-fVar19 | (uint)fVar19 & uVar18) * gridSize);
    uVar18 = 0x400;
    if (0x400 < (uVar6 & 0xffff)) {
      uVar18 = uVar6;
    }
    if (0 < count) {
      local_40 = local_70 + offset;
      uVar6 = (uint)max.m_value - (uint)min.m_value;
      uVar12 = uVar18 & 0xffff;
      local_48 = (ulong)(uVar7 * 3);
      local_50 = (ulong)(uVar7 * 4);
      local_58 = (ulong)(uVar7 * 5);
      local_78 = 4;
      local_7c = 6;
      local_88 = 0;
      local_68 = (ulong)uVar7;
      local_60 = (ulong)(uint)count;
      do {
        local_b0 = 0;
        while( true ) {
          uVar7 = (uint)min.m_value;
          if (min.m_value < max.m_value) {
            dVar1 = deRandom_getUint32(&local_98);
            uVar7 = dVar1 % uVar6 + (uint)min.m_value;
          }
          local_74 = uVar7 - (uVar7 & 0xffff) % (uVar18 & 0xffff);
          uVar9 = (uint)max.m_value - local_74;
          uVar7 = uVar18;
          if ((ushort)uVar18 < (ushort)uVar9) {
            dVar1 = deRandom_getUint32(&local_98);
            uVar7 = dVar1 % ((uVar9 & 0xffff) - uVar12) + uVar18;
          }
          uVar9 = (uint)min.m_value;
          if (min.m_value < max.m_value) {
            dVar1 = deRandom_getUint32(&local_98);
            uVar9 = dVar1 % uVar6 + (uint)min.m_value;
          }
          iVar10 = uVar9 - (uVar9 & 0xffff) % (uVar18 & 0xffff);
          uVar13 = (uint)max.m_value - iVar10;
          uVar9 = uVar18;
          if ((ushort)uVar18 < (ushort)uVar13) {
            dVar1 = deRandom_getUint32(&local_98);
            uVar9 = dVar1 % ((uVar13 & 0xffff) - uVar12) + uVar18;
          }
          uVar7 = uVar7 - (uVar7 & 0xffff) % (uVar18 & 0xffff);
          uVar15 = 0;
          uVar9 = uVar9 - (uVar9 & 0xffff) % (uVar18 & 0xffff);
          if (componentCount < 3) break;
          if (min.m_value < max.m_value) {
            dVar1 = deRandom_getUint32(&local_98);
            uVar16 = dVar1 % uVar6 + (uint)min.m_value;
            uVar16 = uVar16 - (uVar16 & 0xffff) % (uVar18 & 0xffff);
            uVar13 = 1;
            if (componentCount != 3) {
              dVar1 = deRandom_getUint32(&local_98);
              uVar13 = dVar1 % uVar6 + (uint)min.m_value;
              uVar13 = uVar13 - (uVar13 & 0xffff) % (uVar18 & 0xffff);
            }
          }
          else {
            uVar16 = (uint)min.m_value - (uint)min.m_value % (uVar18 & 0xffff);
            uVar13 = uVar16;
            if (componentCount == 3) {
              uVar13 = 1;
            }
          }
          uVar15 = (undefined2)uVar16;
          uVar4 = (undefined2)uVar13;
          if (((uVar12 <= (uVar16 & 0xffff) + (uVar7 & 0xffff)) &&
              (uVar12 <= (uVar13 & 0xffff) + (uVar9 & 0xffff))) || (2 < local_b0))
          goto LAB_01860e5c;
          local_b0 = local_b0 + 1;
        }
        uVar4 = 1;
LAB_01860e5c:
        iVar2 = iVar5 * (int)local_88;
        sVar11 = (short)local_74;
        *(short *)(local_40 + iVar2) = sVar11;
        sVar8 = (short)iVar10;
        *(short *)(local_40 + (iVar2 + 2)) = sVar8;
        iVar10 = (int)local_68;
        sVar14 = (short)uVar7 + sVar11;
        *(short *)(local_40 + (iVar2 + iVar10)) = sVar14;
        *(short *)(local_40 + (iVar2 + iVar10 + 2)) = sVar8;
        sVar17 = (short)uVar9 + sVar8;
        *(short *)(local_40 + (iVar2 + (int)local_38)) = sVar11;
        *(short *)(local_40 + (iVar2 + (int)local_38 + 2)) = sVar17;
        *(short *)(local_40 + (iVar2 + (int)local_48)) = sVar11;
        *(short *)(local_40 + (iVar2 + 2 + (int)local_48)) = sVar17;
        *(short *)(local_40 + (iVar2 + (int)local_50)) = sVar14;
        *(short *)(local_40 + (iVar2 + 2 + (int)local_50)) = sVar8;
        *(short *)(local_40 + (iVar2 + (int)local_58)) = sVar14;
        *(short *)(local_40 + (iVar2 + (int)local_58 + 2)) = sVar17;
        if (2 < componentCount) {
          lVar3 = 6;
          iVar2 = local_78;
          do {
            *(undefined2 *)(local_40 + iVar2) = uVar15;
            iVar2 = iVar2 + iVar10;
            lVar3 = lVar3 + -1;
          } while (lVar3 != 0);
          if (componentCount != 3) {
            lVar3 = 6;
            iVar2 = local_7c;
            do {
              *(undefined2 *)(local_40 + iVar2) = uVar4;
              iVar2 = iVar2 + iVar10;
              lVar3 = lVar3 + -1;
            } while (lVar3 != 0);
          }
        }
        local_88 = local_88 + 1;
        local_78 = local_78 + iVar5;
        local_7c = local_7c + iVar5;
      } while (local_88 != local_60);
    }
  }
  return local_70;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}